

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

char * anon_unknown.dwarf_14170::readlink_strdup(char *path)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  char *__buf;
  ssize_t sVar4;
  ulong __size;
  
  __size = 0x400;
  __buf = (char *)0x0;
  do {
    if (0x3ffffffe < (uint)__size) {
      free(__buf);
      return (char *)0x0;
    }
    uVar1 = (uint)__size * 2;
    __size = (ulong)uVar1;
    __buf = (char *)realloc(__buf,__size);
    sVar4 = readlink("/proc/self/exe",__buf,__size);
    uVar3 = (uint)sVar4;
    if ((int)uVar3 < 0) {
      perror("GetProgramInvocationName:readlink");
      free(__buf);
      __buf = (char *)0x0;
LAB_0010b6cd:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if ((int)uVar3 < (int)uVar1) {
        __buf[uVar3 & 0x7fffffff] = '\0';
        goto LAB_0010b6cd;
      }
    }
    if (!bVar2) {
      return __buf;
    }
  } while( true );
}

Assistant:

inline // NOTE: inline makes us avoid unused function warning
const char* readlink_strdup(const char* path) {
  int sz = 1024;
  char* retval = nullptr;
  for (;;) {
    if (INT_MAX / 2 <= sz) {
      free(retval);
      retval = nullptr;
      break;
    }
    sz *= 2;
    retval = static_cast<char*>(realloc(retval, sz));
    int rc = readlink(path, retval, sz);
    if (rc < 0) {
      perror("GetProgramInvocationName:readlink");
      free(retval);
      retval = nullptr;
      break;
    }
    if (rc < sz) {
      retval[rc] = 0;
      break;
    }
    // repeat if readlink may have truncated it's output
  }
  return retval;
}